

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.h
# Opt level: O2

void __thiscall
cmExportBuildFileGenerator::SetMakefile(cmExportBuildFileGenerator *this,cmMakefile *mf)

{
  cmListFileBacktrace local_40;
  
  this->Makefile = mf;
  cmMakefile::GetBacktrace(&local_40,mf);
  cmListFileBacktrace::operator=(&this->Backtrace,&local_40);
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_40.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  return;
}

Assistant:

void SetMakefile(cmMakefile *mf) {
    this->Makefile = mf;
    this->Backtrace = this->Makefile->GetBacktrace();
  }